

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_avx2.c
# Opt level: O0

void sub_avg_block_avx2(uint8_t *src,int32_t src_stride,uint8_t avg,int32_t width,int32_t height,
                       int16_t *dst,int32_t dst_stride,int use_downsampled_wiener_stats)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  ushort uVar5;
  undefined8 *puVar6;
  int in_ECX;
  byte in_DL;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  long in_R9;
  undefined1 auVar7 [16];
  int in_stack_00000008;
  __m256i d;
  __m256i ss;
  __m128i s;
  int32_t proc_wd;
  int ds_factor;
  int32_t proc_ht;
  __m256i avg_reg;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  int local_18c;
  int local_188;
  int local_184;
  long local_150;
  long local_138;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  uVar5 = (ushort)in_DL;
  auVar1 = vpinsrw_avx(ZEXT216(uVar5),(uint)uVar5,1);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar5,2);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar5,3);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar5,4);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar5,5);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar5,6);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar5,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar5),(uint)uVar5,1);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar5,2);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar5,3);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar5,4);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar5,5);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar5,6);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar5,7);
  auVar7 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  uStack_70 = auVar7._0_8_;
  uStack_68 = auVar7._8_8_;
  local_184 = 0;
  local_150 = in_R9;
  local_138 = in_RDI;
  do {
    local_188 = 1;
    if ((dst_stride != 0) && (local_188 = 4, in_R8D - local_184 < 4)) {
      local_188 = in_R8D - local_184;
    }
    for (local_18c = 0; local_18c < in_ECX; local_18c = local_18c + 0x10) {
      auVar3 = vpmovzxbw_avx2(*(undefined1 (*) [16])(local_138 + local_18c));
      auVar4._16_8_ = uStack_70;
      auVar4._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
      auVar4._24_8_ = uStack_68;
      auVar3 = vpsubw_avx2(auVar3,auVar4);
      puVar6 = (undefined8 *)(local_150 + (long)local_18c * 2);
      local_1e0 = auVar3._0_8_;
      uStack_1d8 = auVar3._8_8_;
      uStack_1d0 = auVar3._16_8_;
      uStack_1c8 = auVar3._24_8_;
      *puVar6 = local_1e0;
      puVar6[1] = uStack_1d8;
      puVar6[2] = uStack_1d0;
      puVar6[3] = uStack_1c8;
    }
    local_138 = local_138 + local_188 * in_ESI;
    local_150 = local_150 + (long)(local_188 * in_stack_00000008) * 2;
    local_184 = local_188 + local_184;
  } while (local_184 < in_R8D);
  return;
}

Assistant:

static inline void sub_avg_block_avx2(const uint8_t *src, int32_t src_stride,
                                      uint8_t avg, int32_t width,
                                      int32_t height, int16_t *dst,
                                      int32_t dst_stride,
                                      int use_downsampled_wiener_stats) {
  const __m256i avg_reg = _mm256_set1_epi16(avg);

  int32_t proc_ht = 0;
  do {
    int ds_factor =
        use_downsampled_wiener_stats ? WIENER_STATS_DOWNSAMPLE_FACTOR : 1;
    if (use_downsampled_wiener_stats &&
        (height - proc_ht < WIENER_STATS_DOWNSAMPLE_FACTOR)) {
      ds_factor = height - proc_ht;
    }

    int32_t proc_wd = 0;
    while (proc_wd < width) {
      const __m128i s = _mm_loadu_si128((__m128i *)(src + proc_wd));
      const __m256i ss = _mm256_cvtepu8_epi16(s);
      const __m256i d = _mm256_sub_epi16(ss, avg_reg);
      _mm256_storeu_si256((__m256i *)(dst + proc_wd), d);
      proc_wd += 16;
    }

    src += ds_factor * src_stride;
    dst += ds_factor * dst_stride;
    proc_ht += ds_factor;
  } while (proc_ht < height);
}